

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dumper.cpp
# Opt level: O0

void __thiscall arangodb::velocypack::Dumper::appendUInt(Dumper *this,uint64_t v)

{
  long lVar1;
  ulong in_RSI;
  long in_RDI;
  
  if (9999999999999999999 < in_RSI) {
    lVar1 = (in_RSI / 10000000000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (999999999999999999 < in_RSI) {
    lVar1 = (in_RSI / 1000000000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (99999999999999999 < in_RSI) {
    lVar1 = (in_RSI / 100000000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (9999999999999999 < in_RSI) {
    lVar1 = (in_RSI / 10000000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (999999999999999 < in_RSI) {
    lVar1 = (in_RSI / 1000000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (99999999999999 < in_RSI) {
    lVar1 = (in_RSI / 100000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (9999999999999 < in_RSI) {
    lVar1 = (in_RSI / 10000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (999999999999 < in_RSI) {
    lVar1 = (in_RSI / 1000000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (99999999999 < in_RSI) {
    lVar1 = (in_RSI / 100000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (9999999999 < in_RSI) {
    lVar1 = (in_RSI / 10000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (999999999 < in_RSI) {
    lVar1 = (in_RSI / 1000000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (99999999 < in_RSI) {
    lVar1 = (in_RSI / 100000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (9999999 < in_RSI) {
    lVar1 = (in_RSI / 10000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (999999 < in_RSI) {
    lVar1 = (in_RSI / 1000000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (99999 < in_RSI) {
    lVar1 = (in_RSI / 100000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (9999 < in_RSI) {
    lVar1 = (in_RSI / 10000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (999 < in_RSI) {
    lVar1 = (in_RSI / 1000) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (99 < in_RSI) {
    lVar1 = (in_RSI / 100) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  if (9 < in_RSI) {
    lVar1 = (in_RSI / 10) % 10 + 0x30;
    (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  }
  lVar1 = in_RSI % 10 + 0x30;
  (**(code **)(**(long **)(in_RDI + 8) + 0x10))(*(long **)(in_RDI + 8),(char)lVar1,lVar1,lVar1);
  return;
}

Assistant:

void Dumper::appendUInt(uint64_t v) {
  if (10000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000000ULL) % 10);
  }
  if (1000000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000000ULL) % 10);
  }
  if (100000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000000ULL) % 10);
  }
  if (10000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000000ULL) % 10);
  }
  if (1000000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000000ULL) % 10);
  }
  if (100000000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000000ULL) % 10);
  }
  if (10000000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000000ULL) % 10);
  }
  if (1000000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000000ULL) % 10);
  }
  if (100000000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000000ULL) % 10);
  }
  if (10000000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000000ULL) % 10);
  }
  if (1000000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000000ULL) % 10);
  }
  if (100000000ULL <= v) {
    _sink->push_back('0' + (v / 100000000ULL) % 10);
  }
  if (10000000ULL <= v) {
    _sink->push_back('0' + (v / 10000000ULL) % 10);
  }
  if (1000000ULL <= v) {
    _sink->push_back('0' + (v / 1000000ULL) % 10);
  }
  if (100000ULL <= v) {
    _sink->push_back('0' + (v / 100000ULL) % 10);
  }
  if (10000ULL <= v) {
    _sink->push_back('0' + (v / 10000ULL) % 10);
  }
  if (1000ULL <= v) {
    _sink->push_back('0' + (v / 1000ULL) % 10);
  }
  if (100ULL <= v) {
    _sink->push_back('0' + (v / 100ULL) % 10);
  }
  if (10ULL <= v) {
    _sink->push_back('0' + (v / 10ULL) % 10);
  }

  _sink->push_back('0' + (v % 10));
}